

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O1

void re2::Parse_CachedDigits_Backtrack(int i)

{
  StringPiece local_18;
  
  BenchmarkMemoryUsage();
  local_18.ptr_ = "650-253-0001";
  local_18.length_ = 0xc;
  Parse3CachedBacktrack(i,"([0-9]+)-([0-9]+)-([0-9]+)",&local_18);
  SetBenchmarkItemsProcessed(i);
  return;
}

Assistant:

void Parse_CachedDigits_Backtrack(int i)   { Parse3Digits(i, Parse3CachedBacktrack); }